

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O1

int cram_index_build(cram_fd *fd,char *fn_base)

{
  hFILE *phVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  cram_block_slice_hdr *pcVar7;
  bool bVar8;
  int iVar9;
  size_t sVar10;
  zfp *zf;
  cram_container *c;
  cram_block *b;
  cram_block_compression_hdr *pcVar11;
  cram_slice *s;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  int local_146c;
  char *local_1460;
  char buf [1024];
  char fn_idx [4096];
  
  sVar10 = strlen(fn_base);
  local_146c = -1;
  if (sVar10 < 0xffb) {
    sprintf(fn_idx,"%s.crai",fn_base);
    zf = zfopen(fn_idx,"wz");
    if (zf == (zfp *)0x0) {
      perror(fn_idx);
    }
    else {
      phVar1 = fd->fp;
      local_1460 = phVar1->begin + (phVar1->offset - (long)phVar1->buffer);
      do {
        c = cram_read_container(fd);
        if (c == (cram_container *)0x0) {
          iVar9 = fd->err;
          uVar17 = zfclose(zf);
          return uVar17 | -(uint)(iVar9 != 0);
        }
        if (fd->err == 0) {
          phVar1 = fd->fp;
          lVar2 = phVar1->offset;
          pcVar3 = phVar1->begin;
          pcVar4 = phVar1->buffer;
          b = cram_read_block(fd);
          c->comp_hdr_block = b;
          if (b == (cram_block *)0x0) goto LAB_0012bac2;
          if (b->content_type != COMPRESSION_HEADER) {
            __assert_fail("c->comp_hdr_block->content_type == COMPRESSION_HEADER",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_index.c"
                          ,0x1fd,"int cram_index_build(cram_fd *, const char *)");
          }
          pcVar11 = cram_decode_compression_header(fd,b);
          c->comp_hdr = pcVar11;
          if (pcVar11 == (cram_block_compression_hdr *)0x0) {
            local_146c = -1;
            goto LAB_0012baca;
          }
          if (0 < c->num_landmarks) {
            lVar19 = 0;
            do {
              phVar1 = fd->fp;
              lVar15 = phVar1->offset;
              pcVar5 = phVar1->begin;
              pcVar6 = phVar1->buffer;
              if ((long)(pcVar5 + (lVar15 - (long)pcVar6)) - (long)(local_1460 + c->offset) !=
                  (long)c->landmark[lVar19]) {
                __assert_fail("spos - cpos - c->offset == c->landmark[j]",
                              "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_index.c"
                              ,0x20a,"int cram_index_build(cram_fd *, const char *)");
              }
              s = cram_read_slice(fd);
              if (s == (cram_slice *)0x0) {
                zfclose(zf);
                local_146c = -1;
              }
              else {
                phVar1 = fd->fp;
                uVar18 = (ulong)(uint)(((int)phVar1->offset + *(int *)&phVar1->begin) -
                                      ((int)(pcVar5 + (lVar15 - (long)pcVar6)) +
                                      *(int *)&phVar1->buffer));
                pcVar7 = s->hdr;
                uVar14 = (ulong)(uint)pcVar7->ref_seq_id;
                if (pcVar7->ref_seq_id == 0xfffffffe) {
                  uVar12 = (ulong)(uint)c->landmark[lVar19];
                  iVar9 = cram_decode_slice(fd,c,s,fd->header);
                  if (iVar9 == 0) {
                    if (s->hdr->num_records < 1) {
                      iVar16 = 1;
                      iVar9 = -0x80000000;
                      uVar13 = 0;
                      uVar14 = 0xfffffffe;
                    }
                    else {
                      uVar14 = 0xfffffffe;
                      iVar9 = -0x80000000;
                      lVar20 = 0;
                      lVar15 = 0;
                      iVar16 = 0;
                      uVar13 = 0;
                      do {
                        if (*(int *)((long)&s->crecs->ref_id + lVar20) == (int)uVar14) {
                          iVar16 = *(int *)((long)&s->crecs->aend + lVar20);
                          if (iVar9 <= iVar16) {
                            iVar9 = iVar16;
                          }
                        }
                        else {
                          if ((int)uVar14 != -2) {
                            sprintf(buf,"%d\t%d\t%d\t%ld\t%d\t%d\n",uVar14,uVar13,
                                    (ulong)(iVar16 + iVar9 + 1),local_1460,uVar12,uVar18);
                            zfputs(buf,zf);
                          }
                          uVar14 = (ulong)*(uint *)((long)&s->crecs->ref_id + lVar20);
                          uVar13 = (ulong)*(uint *)((long)&s->crecs->apos + lVar20);
                          iVar9 = -0x80000000;
                        }
                        lVar15 = lVar15 + 1;
                        iVar16 = -(int)uVar13;
                        lVar20 = lVar20 + 0x70;
                      } while (lVar15 < s->hdr->num_records);
                      iVar16 = 1 - (int)uVar13;
                    }
                    if ((int)uVar14 != -2) {
                      uVar17 = iVar16 + iVar9;
                      goto LAB_0012ba05;
                    }
                  }
                }
                else {
                  uVar13 = (ulong)(uint)pcVar7->ref_seq_start;
                  uVar17 = pcVar7->ref_seq_span;
                  uVar12 = (ulong)(uint)c->landmark[lVar19];
LAB_0012ba05:
                  sprintf(buf,"%d\t%d\t%d\t%ld\t%d\t%d\n",uVar14,uVar13,(ulong)uVar17,local_1460,
                          uVar12,uVar18);
                  zfputs(buf,zf);
                }
                cram_free_slice(s);
              }
              if (s == (cram_slice *)0x0) goto LAB_0012baca;
              lVar19 = lVar19 + 1;
            } while (lVar19 < c->num_landmarks);
          }
          phVar1 = fd->fp;
          local_1460 = phVar1->begin + (phVar1->offset - (long)phVar1->buffer);
          if (local_1460 != pcVar3 + (long)c->length + (lVar2 - (long)pcVar4)) {
            __assert_fail("cpos == hpos + c->length",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_index.c"
                          ,0x222,"int cram_index_build(cram_fd *, const char *)");
          }
          cram_free_container(c);
          bVar8 = true;
        }
        else {
          perror("Cram container read");
LAB_0012bac2:
          local_146c = 1;
LAB_0012baca:
          bVar8 = false;
        }
      } while (bVar8);
    }
  }
  return local_146c;
}

Assistant:

int cram_index_build(cram_fd *fd, const char *fn_base) {
    cram_container *c;
    off_t cpos, spos, hpos;
    zfp *fp;
    char fn_idx[PATH_MAX];

    if (strlen(fn_base) > PATH_MAX-6)
	return -1;

    sprintf(fn_idx, "%s.crai", fn_base);
    if (!(fp = zfopen(fn_idx, "wz"))) {
        perror(fn_idx);
        return -1;
    }

    cpos = htell(fd->fp);
    while ((c = cram_read_container(fd))) {
        int j;

        if (fd->err) {
            perror("Cram container read");
            return 1;
        }

        hpos = htell(fd->fp);

        if (!(c->comp_hdr_block = cram_read_block(fd)))
            return 1;
        assert(c->comp_hdr_block->content_type == COMPRESSION_HEADER);

        c->comp_hdr = cram_decode_compression_header(fd, c->comp_hdr_block);
        if (!c->comp_hdr)
            return -1;

        // 2.0 format
        for (j = 0; j < c->num_landmarks; j++) {
            char buf[1024];
            cram_slice *s;
            int sz;

            spos = htell(fd->fp);
            assert(spos - cpos - c->offset == c->landmark[j]);

            if (!(s = cram_read_slice(fd))) {
		zfclose(fp);
		return -1;
	    }

            sz = (int)(htell(fd->fp) - spos);

	    if (s->hdr->ref_seq_id == -2) {
		cram_index_build_multiref(fd, c, s, fp,
					  cpos, c->landmark[j], sz);
	    } else {
		sprintf(buf, "%d\t%d\t%d\t%"PRId64"\t%d\t%d\n",
			s->hdr->ref_seq_id, s->hdr->ref_seq_start,
			s->hdr->ref_seq_span, (int64_t)cpos,
			c->landmark[j], sz);
		zfputs(buf, fp);
	    }

            cram_free_slice(s);
        }

        cpos = htell(fd->fp);
        assert(cpos == hpos + c->length);

        cram_free_container(c);
    }
    if (fd->err) {
	zfclose(fp);
	return -1;
    }
	

    return zfclose(fp);
}